

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  EnumOptions *options;
  EnumValueDescriptorProto *enum_value;
  LocationRecorder location;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = LookingAt(this,"option");
    if (bVar1) {
      LocationRecorder::LocationRecorder(&location,enum_location,3);
      options = EnumDescriptorProto::_internal_mutable_options(enum_type);
      bVar2 = ParseOption(this,&options->super_Message,&location,containing_file,OPTION_STATEMENT);
    }
    else {
      bVar1 = LookingAt(this,"reserved");
      if (bVar1) {
        bVar1 = ParseReserved(this,enum_type,enum_location);
        return bVar1;
      }
      LocationRecorder::LocationRecorder
                (&location,enum_location,2,
                 (enum_type->value_).super_RepeatedPtrFieldBase.current_size_);
      enum_value = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Add
                             (&enum_type->value_);
      bVar2 = ParseEnumConstant(this,enum_value,&location,containing_file);
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("reserved")) {
    return ParseReserved(enum_type, enum_location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kValueFieldNumber,
                              enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}